

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,int length,size_t *tick,size_t tick_len,ostream *ofs
          ,t_BuildProcessingQueueType *queue)

{
  iterator *piVar1;
  pointer *ppcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Map_pointer ppbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pcVar8;
  iterator __position;
  pointer pcVar9;
  pointer pcVar10;
  pointer pcVar11;
  _Elt_pointer pbVar12;
  cmCTest *pcVar13;
  bool bVar14;
  size_t sVar15;
  vector<char,std::allocator<char>> *this_00;
  int iVar16;
  size_t sVar17;
  _Map_pointer ppbVar18;
  ostream *poVar19;
  char *pcVar20;
  ulong uVar21;
  char *pcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  _Elt_pointer pbVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  ulong uVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  long lVar28;
  _Elt_pointer pbVar29;
  bool bVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCTestBuildErrorWarning errorwarning;
  undefined1 local_250 [24];
  _Map_pointer local_238;
  ulong *local_230;
  deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_228;
  int local_21c;
  ostream *local_218;
  long local_210;
  char *local_208;
  size_t local_200;
  t_ErrorsAndWarningsVector *local_1f8;
  vector<char,std::allocator<char>> *local_1f0;
  undefined1 local_1e8 [112];
  _Alloc_hider local_178;
  char *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [13];
  iterator local_70;
  iterator local_50;
  
  lVar28 = (long)length;
  local_230 = tick;
  local_218 = ofs;
  local_200 = tick_len;
  if (0 < length) {
    pcVar22 = data;
    do {
      pcVar20 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (pcVar20 ==
          (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
          _M_finish._M_last + -1) {
        std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                  ((deque<char,std::allocator<char>> *)queue,pcVar22);
      }
      else {
        *pcVar20 = *pcVar22;
        piVar1 = &(queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      pcVar22 = pcVar22 + 1;
    } while (pcVar22 < data + lVar28);
  }
  this->BuildOutputLogSize = this->BuildOutputLogSize + lVar28;
  local_1f0 = (vector<char,std::allocator<char>> *)&this->CurrentProcessingLine;
  local_228 = (deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->PreContext;
  local_1f8 = &this->ErrorsAndWarnings;
  local_21c = length;
  local_210 = lVar28;
  local_208 = data;
  do {
    this_00 = local_1f0;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_first;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    ppbVar6 = (_Map_pointer)
              (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    pbVar23 = pbVar4;
    pbVar25 = pbVar3;
    pbVar27 = pbVar5;
    ppbVar18 = ppbVar6;
    if (pbVar3 == pbVar7) {
      bVar14 = true;
    }
    else {
      do {
        bVar30 = *(char *)&(pbVar25->_M_dataplus)._M_p == '\n';
        bVar14 = !bVar30;
        if (bVar30) break;
        pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(pbVar25->_M_dataplus)._M_p + 1);
        if (pbVar25 == pbVar27) {
          pbVar23 = ppbVar18[1];
          ppbVar18 = ppbVar18 + 1;
          pbVar27 = pbVar23 + 0x10;
          pbVar25 = pbVar23;
        }
      } while (pbVar25 != pbVar7);
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    if (bVar14) break;
    pcVar8 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar8) {
      (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar8;
    }
    local_250._0_8_ = pbVar25;
    local_250._8_8_ = pbVar23;
    local_250._16_8_ = pbVar27;
    local_238 = ppbVar18;
    local_1e8._0_8_ = pbVar3;
    local_1e8._8_8_ = pbVar4;
    local_1e8._16_8_ = pbVar5;
    local_1e8._24_8_ = ppbVar6;
    std::vector<char,std::allocator<char>>::_M_range_insert<std::_Deque_iterator<char,char&,char*>>
              (local_1f0,pcVar8,local_1e8,(iterator *)local_250);
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffffffffff00;
    __position._M_current =
         (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                ((vector<char,_std::allocator<char>_> *)this_00,__position,local_1e8);
    }
    else {
      *__position._M_current = '\0';
      ppcVar2 = &(this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar2 = *ppcVar2 + 1;
    }
    pcVar22 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar16 = ProcessSingleLine(this,pcVar22);
    local_1e8._0_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_1e8._24_8_ =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
    uVar26 = ((long)pbVar25 - (long)pbVar23) + 1;
    if ((long)pbVar25 - (long)pbVar23 < -1) {
      uVar21 = (long)uVar26 >> 9;
LAB_0026b5e5:
      ppbVar18 = ppbVar18 + uVar21;
      local_250._0_8_ = uVar26 + uVar21 * -0x200 + (long)*ppbVar18;
    }
    else {
      if (0x1ff < uVar26) {
        uVar21 = uVar26 >> 9;
        goto LAB_0026b5e5;
      }
      local_250._0_8_ = (long)&(pbVar25->_M_dataplus)._M_p + 1;
    }
    pbVar12 = (_Elt_pointer)(local_250 + 0x10);
    local_1e8._8_8_ = *(undefined8 *)local_1e8._24_8_;
    local_1e8._16_8_ = local_1e8._8_8_ + 0x200;
    local_250._8_8_ = *ppbVar18;
    local_250._16_8_ = local_250._8_8_ + 0x200;
    local_238 = ppbVar18;
    std::deque<char,_std::allocator<char>_>::_M_erase
              ((iterator *)&local_70,queue,(iterator *)local_1e8,(iterator *)local_250);
    local_1e8._8_8_ = local_1e8 + 0x18;
    local_1e8._16_8_ = (_Elt_pointer)0x0;
    local_1e8._24_8_ = local_1e8._24_8_ & 0xffffffffffffff00;
    local_1e8._40_8_ = local_1e8 + 0x38;
    local_1e8._48_8_ = 0;
    local_1e8[0x38] = '\0';
    local_1e8._72_8_ = local_1e8 + 0x58;
    local_1e8._80_8_ = 0;
    local_1e8[0x58] = '\0';
    local_178._M_p = (pointer)&local_168;
    local_170 = (char *)0x0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_p = (pointer)local_148;
    local_150 = (char *)0x0;
    local_148[0]._M_local_buf[0] = '\0';
    if (iVar16 == 2) {
      this->LastTickChar = '!';
      local_1e8[0] = 1;
      this->TotalErrors = this->TotalErrors + 1;
LAB_0026b733:
      local_1e8._4_4_ = (int)this->OutputLineCounter + 1;
      strlen(pcVar22);
      std::__cxx11::string::_M_replace((ulong)(local_1e8 + 8),0,(char *)0x0,(ulong)pcVar22);
      std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x5e12e9);
      std::__cxx11::string::_M_replace((ulong)&local_158,0,local_150,0x5e12e9);
      pbVar24 = (this->PreContext).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (pbVar24 !=
          (this->PreContext).
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        pbVar29 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppbVar18 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          pcVar9 = (pbVar24->_M_dataplus)._M_p;
          local_250._0_8_ = pbVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_250,pcVar9,pcVar9 + pbVar24->_M_string_length);
          std::__cxx11::string::append((char *)local_250);
          std::__cxx11::string::_M_append((char *)&local_178,local_250._0_8_);
          if ((_Elt_pointer)local_250._0_8_ != pbVar12) {
            operator_delete((void *)local_250._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
          }
          pbVar24 = pbVar24 + 1;
          if (pbVar24 == pbVar29) {
            pbVar24 = ppbVar18[1];
            ppbVar18 = ppbVar18 + 1;
            pbVar29 = pbVar24 + 0x10;
          }
        } while (pbVar24 !=
                 (this->PreContext).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(local_1f8,(value_type *)local_1e8);
      (this->LastErrorOrWarning)._M_current =
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      this->PostContextCount = 0;
    }
    else {
      if (iVar16 == 1) {
        this->LastTickChar = '*';
        local_1e8._0_4_ = SUB84(local_1e8._0_8_,1) << 8;
        this->TotalWarnings = this->TotalWarnings + 1;
        goto LAB_0026b733;
      }
      pcVar10 = (this->ErrorsAndWarnings).
                super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((((this->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start == pcVar10) ||
          (pcVar11 = (this->LastErrorOrWarning)._M_current, pcVar11 == pcVar10)) ||
         (this->MaxPostContext <= this->PostContextCount)) {
        if (pcVar22 == (char *)0x0) {
          pcVar20 = (char *)0x1;
          local_250._0_8_ = pbVar12;
        }
        else {
          local_250._0_8_ = pbVar12;
          sVar17 = strlen(pcVar22);
          pcVar20 = pcVar22 + sVar17;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_250,pcVar22,pcVar20);
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
        if ((_Elt_pointer)local_250._0_8_ != pbVar12) {
          operator_delete((void *)local_250._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
        }
        ppbVar18 = (this->PreContext).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppbVar6 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        pbVar12 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        lVar28 = (long)pbVar12 -
                 (long)(this->PreContext).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5;
        uVar26 = this->MaxPreContext;
        pbVar24 = (this->PreContext).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (uVar26 < ((long)(this->PreContext).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pbVar24 >> 5) +
                     lVar28 + ((((ulong)((long)ppbVar18 - (long)ppbVar6) >> 3) - 1) +
                              (ulong)(ppbVar18 == (_Map_pointer)0x0)) * 0x10) {
          uVar21 = lVar28 - uVar26;
          if ((long)uVar21 < 0) {
            uVar26 = (long)uVar21 >> 4;
LAB_0026bae5:
            ppbVar18 = ppbVar18 + uVar26;
            local_70._M_cur = *ppbVar18 + uVar21 + uVar26 * -0x10;
          }
          else {
            if (0xf < uVar21) {
              uVar26 = uVar21 >> 4;
              goto LAB_0026bae5;
            }
            local_70._M_cur = pbVar12 + -uVar26;
          }
          local_250._8_8_ = *ppbVar6;
          local_250._16_8_ = local_250._8_8_ + 0x200;
          local_70._M_first = *ppbVar18;
          local_70._M_last = local_70._M_first + 0x10;
          local_250._0_8_ = pbVar24;
          local_238 = ppbVar6;
          local_70._M_node = ppbVar18;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_50,
                     (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_228,(iterator *)local_250,&local_70);
        }
      }
      else {
        this->PostContextCount = this->PostContextCount + 1;
        std::__cxx11::string::append((char *)&pcVar11->PostContext);
        if (this->PostContextCount < this->MaxPostContext) {
          std::__cxx11::string::append
                    ((char *)&((this->LastErrorOrWarning)._M_current)->PostContext);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_p != local_148) {
      operator_delete(local_158._M_p,
                      CONCAT71(local_148[0]._M_allocated_capacity._1_7_,local_148[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != &local_168) {
      operator_delete(local_178._M_p,
                      CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_1e8._72_8_ != local_1e8 + 0x58) {
      operator_delete((void *)local_1e8._72_8_,CONCAT71(local_1e8._89_7_,local_1e8[0x58]) + 1);
    }
    if ((undefined1 *)local_1e8._40_8_ != local_1e8 + 0x38) {
      operator_delete((void *)local_1e8._40_8_,CONCAT71(local_1e8._57_7_,local_1e8[0x38]) + 1);
    }
    if ((undefined1 *)local_1e8._8_8_ != local_1e8 + 0x18) {
      operator_delete((void *)local_1e8._8_8_,local_1e8._24_8_ + 1);
    }
  } while (!bVar14);
  sVar15 = local_200;
  uVar26 = *local_230;
  if (uVar26 * local_200 < this->BuildOutputLogSize) {
    do {
      *local_230 = uVar26 + 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      local_250[0] = this->LastTickChar;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,local_250,1);
      pcVar13 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar13,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x49b,(char *)local_250._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base((ios_base *)&local_178);
      uVar26 = *local_230;
      if ((uVar26 != 0) && (uVar26 == (uVar26 / 0x32) * 0x32)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"  Size: ",8);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"K",1);
        std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
        std::ostream::put((char)poVar19);
        poVar19 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"    ",4);
        pcVar13 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar13,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x4a1,(char *)local_250._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base((ios_base *)&local_178);
        uVar26 = *local_230;
      }
    } while (uVar26 * sVar15 < this->BuildOutputLogSize);
    this->LastTickChar = '.';
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  pcVar22 = local_208;
  iVar16 = local_21c;
  if (local_21c != 0) {
    std::ostream::write(local_1e8,(long)local_208);
    std::ostream::flush();
  }
  pcVar13 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar13,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x4ab,(char *)local_250._0_8_,false);
  if ((_Elt_pointer)local_250._0_8_ != (_Elt_pointer)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_250._16_8_)->_M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base((ios_base *)&local_178);
  if (iVar16 != 0) {
    std::ostream::write((char *)local_218,(long)pcVar22);
    std::ostream::flush();
  }
  return;
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, int length,
  size_t& tick, size_t tick_len, std::ostream& ofs,
  t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for ( ptr = data; ptr < data+length; ptr ++ )
    {
    queue->push_back(*ptr);
    }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while ( 1 )
    {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for ( it = queue->begin();
      it != queue->end();
      ++ it )
      {
      if ( *it == '\n' )
        {
        break;
        }
      }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if ( this->TotalWarnings >= this->MaxWarnings )
      {
      this->WarningQuotaReached = true;
      }
    if ( this->TotalErrors >= this->MaxErrors )
      {
      this->ErrorQuotaReached = true;
      }

    // If the end of line was found
    if ( it != queue->end() )
      {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      this->CurrentProcessingLine.insert(this->CurrentProcessingLine.end(),
                                         queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = &*this->CurrentProcessingLine.begin();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it+1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch ( lineType )
        {
      case b_WARNING_LINE:
        this->LastTickChar = '*';
        errorwarning.Error = false;
        found = true;
        this->TotalWarnings ++;
        break;
      case b_ERROR_LINE:
        this->LastTickChar = '!';
        errorwarning.Error = true;
        found = true;
        this->TotalErrors ++;
        break;
        }
      if ( found )
        {
        // This is an error or warning, so generate report
        errorwarning.LogLine   = static_cast<int>(this->OutputLineCounter+1);
        errorwarning.Text        = line;
        errorwarning.PreContext  = "";
        errorwarning.PostContext = "";

        // Copy pre-context to report
        std::deque<std::string>::iterator pcit;
        for ( pcit = this->PreContext.begin();
          pcit != this->PreContext.end();
          ++pcit )
          {
          errorwarning.PreContext += *pcit + "\n";
          }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(errorwarning);
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end()-1;
        this->PostContextCount = 0;
        }
      else
        {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if ( !this->ErrorsAndWarnings.empty() &&
             this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
             this->PostContextCount < this->MaxPostContext )
          {
          this->PostContextCount ++;
          this->LastErrorOrWarning->PostContext += line;
          if ( this->PostContextCount < this->MaxPostContext )
            {
            this->LastErrorOrWarning->PostContext += "\n";
            }
          }
        else
          {
          // Otherwise store pre-context for the next error
          this->PreContext.push_back(line);
          if ( this->PreContext.size() > this->MaxPreContext )
            {
            this->PreContext.erase(this->PreContext.begin(),
              this->PreContext.end()-this->MaxPreContext);
            }
          }
        }
      this->OutputLineCounter ++;
      }
    else
      {
      break;
      }
    }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while ( this->BuildOutputLogSize > (tick * tick_len) )
    {
    tick ++;
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, this->LastTickChar,
      this->Quiet);
    tickDisplayed = true;
    if ( tick % tick_line_len == 0 && tick > 0 )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Size: "
        << ((this->BuildOutputLogSize + 512) / 1024) << "K" << std::endl
        << "    ", this->Quiet);
      }
    }
  if ( tickDisplayed )
    {
    this->LastTickChar = '.';
    }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}